

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

_Bool match_column(ecs_world_t *world,ecs_type_t type,ecs_sig_from_kind_t from_kind,
                  ecs_entity_t component,ecs_entity_t source,ecs_match_failure_t *failure_info)

{
  _Bool _Var1;
  ecs_entity_t eVar2;
  
  _Var1 = true;
  switch(from_kind) {
  case EcsFromAny:
    failure_info->reason = EcsMatchFromSelf;
    break;
  case EcsFromOwned:
    failure_info->reason = EcsMatchFromOwned;
    _Var1 = true;
    goto LAB_00118bf4;
  case EcsFromShared:
    failure_info->reason = EcsMatchFromShared;
    _Var1 = ecs_type_owns_entity(world,type,component,true);
    if (_Var1) {
      return false;
    }
    _Var1 = false;
LAB_00118bf4:
    _Var1 = ecs_type_owns_entity(world,type,component,_Var1);
    return _Var1;
  case EcsFromParent:
    failure_info->reason = EcsMatchFromContainer;
    eVar2 = ecs_find_in_type(world,type,component,0xfd00000000000000);
    _Var1 = eVar2 != 0;
  default:
    return _Var1;
  case EcsFromEntity:
    failure_info->reason = EcsMatchFromEntity;
    type = ecs_get_type(world,source);
  }
  _Var1 = ecs_type_has_entity(world,type,component);
  return _Var1;
}

Assistant:

static
bool match_column(
    ecs_world_t *world,
    ecs_type_t type,
    ecs_sig_from_kind_t from_kind,
    ecs_entity_t component,
    ecs_entity_t source,
    ecs_match_failure_t *failure_info)
{
    if (from_kind == EcsFromAny) {
        failure_info->reason = EcsMatchFromSelf;
        return ecs_type_has_entity(world, type, component);
        
    } else if (from_kind == EcsFromOwned) {
        failure_info->reason = EcsMatchFromOwned;
        return ecs_type_owns_entity(world, type, component, true);

    } else if (from_kind == EcsFromShared) {
        failure_info->reason = EcsMatchFromShared;
        return !ecs_type_owns_entity(world, type, component, true) &&
            ecs_type_owns_entity(world, type, component, false);

    } else if (from_kind == EcsFromParent) {
        failure_info->reason = EcsMatchFromContainer;
        return ecs_find_in_type(world, type, component, ECS_CHILDOF) != 0;

    } else if (from_kind == EcsFromEntity) {
        failure_info->reason = EcsMatchFromEntity;
        ecs_type_t source_type = ecs_get_type(world, source);
        return ecs_type_has_entity(world, source_type, component);
    } else {
        return true;
    }
}